

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O3

compressed_lower_distance_matrix *
read_file(compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream,
         file_format format)

{
  logic_error *this;
  
  switch(format) {
  case LOWER_DISTANCE_MATRIX:
    read_lower_distance_matrix(__return_storage_ptr__,input_stream);
    break;
  case UPPER_DISTANCE_MATRIX:
    read_upper_distance_matrix(__return_storage_ptr__,input_stream);
    break;
  case DISTANCE_MATRIX:
    read_distance_matrix(__return_storage_ptr__,input_stream);
    break;
  case POINT_CLOUD:
    read_point_cloud(__return_storage_ptr__,input_stream);
    break;
  case DIPHA:
    read_dipha(__return_storage_ptr__,input_stream);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Format not known.");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return __return_storage_ptr__;
}

Assistant:

compressed_lower_distance_matrix read_file(std::istream& input_stream, file_format format) {
	switch (format) {
	case LOWER_DISTANCE_MATRIX:
		return read_lower_distance_matrix(input_stream);
	case UPPER_DISTANCE_MATRIX:
		return read_upper_distance_matrix(input_stream);
	case DISTANCE_MATRIX:
		return read_distance_matrix(input_stream);
	case POINT_CLOUD:
		return read_point_cloud(input_stream);
	case DIPHA:
		return read_dipha(input_stream);
	default:
		throw std::logic_error("Format not known.");
	}
}